

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O0

void __thiscall
ConfigParser::ParseConfig
          (ConfigParser *this,HANDLE hmod,CmdLineArgsParser *parser,char16 *strCustomConfigFile)

{
  ConfigFlagsTable *pCVar1;
  code *pcVar2;
  bool bVar3;
  errno_t eVar4;
  DWORD DVar5;
  int iVar6;
  undefined4 *puVar7;
  bool local_e9a;
  int local_e90;
  int local_e8c;
  int curChar;
  int index;
  char16 configBuffer [512];
  WCHAR configFileFullName [260];
  WCHAR local_878 [4];
  WCHAR homeDir [260];
  PAL_FILE *configFile;
  char16 dir [256];
  WCHAR local_45e [3];
  WCHAR local_458;
  char16 drive [3];
  char16 filename [260];
  WCHAR local_248 [4];
  char16 modulename [260];
  char16_t *pcStack_38;
  int err;
  char16 *configFileExt;
  char16 *configFileName;
  char16 *strCustomConfigFile_local;
  CmdLineArgsParser *parser_local;
  HANDLE hmod_local;
  ConfigParser *this_local;
  
  if (((this->_hasReadConfig & 1U) != 0) && (strCustomConfigFile == (char16 *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x17a,"(!_hasReadConfig || strCustomConfigFile != nullptr)",
                       "!_hasReadConfig || strCustomConfigFile != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this->_hasReadConfig = true;
  pcStack_38 = L"";
  configFileExt = strCustomConfigFile;
  if (strCustomConfigFile == (char16 *)0x0) {
    configFileExt = this->_configFileName;
    pcStack_38 = L".config";
  }
  modulename[0x102] = L'\0';
  modulename[0x103] = L'\0';
  GetModuleFileNameW(hmod,local_248,0x104);
  _wsplitpath_s(local_248,local_45e,3,(WCHAR *)&configFile,0x100,(WCHAR *)0x0,0,(WCHAR *)0x0,0);
  _wmakepath_s<260ul>((WCHAR (*) [260])&local_458,local_45e,(WCHAR *)&configFile,configFileExt,
                      pcStack_38);
  eVar4 = _wfopen_unsafe((PAL_FILE **)(homeDir + 0x100),&local_458,L"r");
  if ((eVar4 != 0) || (homeDir._512_8_ == 0)) {
    DVar5 = GetEnvironmentVariableW(L"HOME",local_878,0x104);
    if (DVar5 == 0) {
      return;
    }
    StringCchPrintfW(configBuffer + 0x1fc,0x104,L"%s/%s%s",local_878,configFileExt,pcStack_38);
    eVar4 = _wfopen_unsafe((PAL_FILE **)(homeDir + 0x100),configBuffer + 0x1fc,L"r");
    if (eVar4 != 0) {
      return;
    }
    if (homeDir._512_8_ == 0) {
      return;
    }
  }
  local_e8c = 0;
  while (local_e8c < 0x200) {
    local_e90 = PAL_getc((PAL_FILE *)homeDir._512_8_);
    if ((uint)this->_flags->rawInputFromConfigFileIndex < 0x200) {
      pCVar1 = this->_flags;
      iVar6 = this->_flags->rawInputFromConfigFileIndex;
      this->_flags->rawInputFromConfigFileIndex = iVar6 + 1;
      pCVar1->rawInputFromConfigFile[iVar6] = (char16)local_e90;
    }
    if (((local_e90 == -1) || (iVar6 = isspace(local_e90), iVar6 != 0)) || (local_e90 == 0)) {
      *(undefined2 *)((long)&curChar + (long)local_e8c * 2) = 0;
      if ((0 < local_e8c) &&
         (modulename._516_4_ = CmdLineArgsParser::Parse(parser,(LPWSTR)&curChar),
         modulename._516_4_ != 0)) break;
      while( true ) {
        local_e9a = false;
        if (local_e90 != -1) {
          iVar6 = isspace(local_e90);
          local_e9a = iVar6 != 0 || local_e90 == 0;
        }
        if (!local_e9a) break;
        local_e90 = PAL_getc((PAL_FILE *)homeDir._512_8_);
      }
      if (local_e90 == -1) break;
      PAL_ungetc(local_e90,(PAL_FILE *)homeDir._512_8_);
      local_e8c = 0;
    }
    else {
      *(char16 *)((long)&curChar + (long)local_e8c * 2) = (char16)local_e90;
      local_e8c = local_e8c + 1;
    }
  }
  PAL_fclose((PAL_FILE *)homeDir._512_8_);
  return;
}

Assistant:

void ConfigParser::ParseConfig(HANDLE hmod, CmdLineArgsParser &parser, const char16* strCustomConfigFile)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && CONFIG_PARSE_CONFIG_FILE
    Assert(!_hasReadConfig || strCustomConfigFile != nullptr);
    _hasReadConfig = true;

    const char16* configFileName = strCustomConfigFile;
    const char16* configFileExt = _u(""); /* in the custom config case,
                                             ext is expected to be passed
                                             in as part of the filename */

    if (configFileName == nullptr)
    {
        configFileName = _configFileName;
        configFileExt = _u(".config");
    }

    int err = 0;
    char16 modulename[_MAX_PATH];
    char16 filename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);
    char16 drive[_MAX_DRIVE];
    char16 dir[_MAX_DIR];

    _wsplitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _wmakepath_s(filename, drive, dir, configFileName, configFileExt);

    FILE* configFile;
#ifdef _WIN32
    if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
    {
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s%s"), configFileName, configFileExt);

        // try the one in the current working directory (Desktop)
        if (_wfullpath(filename, configFileFullName, _MAX_PATH) == nullptr)
        {
            return;
        }

        if (_wfopen_s(&configFile, filename, _u("r, ccs=UNICODE")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#else
    // Two-pathed for a couple reasons
    // 1. PAL doesn't like the ccs option passed in.
    // 2. _wfullpath is not implemented in the PAL.
    // Instead, on xplat, we'll check the HOME directory to see if there is
    // a config file there that we can use
    if (_wfopen_s(&configFile, filename, _u("r")) != 0 || configFile == nullptr)
    {
        WCHAR homeDir[MAX_PATH];

        if (GetEnvironmentVariable(_u("HOME"), homeDir, MAX_PATH) == 0)
        {
            return;
        }
        
        WCHAR configFileFullName[MAX_PATH];

        StringCchPrintf(configFileFullName, MAX_PATH, _u("%s/%s%s"), homeDir, configFileName, configFileExt);
        if (_wfopen_s(&configFile, configFileFullName, _u("r")) != 0 || configFile == nullptr)
        {
            return;
        }
    }
#endif

    char16 configBuffer[MaxTokenSize];
    int index = 0;

#ifdef _WIN32
#define ReadChar(file) fgetwc(file)
#define UnreadChar(c, file) ungetwc(c, file)
#define CharType wint_t
#define EndChar WEOF
#else
#define ReadChar(file) fgetc(file)
#define UnreadChar(c, file) ungetc(c, file)
#define CharType int
#define EndChar EOF
#endif

    // We don't expect the token to overflow- if it does
    // the simplest thing to do would be to ignore the
    // read tokens
    // We could use _fwscanf_s here but the function
    // isn't implemented in the PAL and we'd have to deal with
    // wchar => char16 impedance mismatch.
    while (index < MaxTokenSize)
    {
        CharType curChar = ReadChar(configFile);

        if (this->_flags.rawInputFromConfigFileIndex < sizeof(this->_flags.rawInputFromConfigFile) / sizeof(this->_flags.rawInputFromConfigFile[0]))
        {
            this->_flags.rawInputFromConfigFile[this->_flags.rawInputFromConfigFileIndex++] = curChar;
        }

        if (curChar == EndChar || isspace(curChar) || curChar == 0)
        {
            configBuffer[index] = 0;

            // Parse only if there's something in configBuffer
            if (index > 0 && (err = parser.Parse(configBuffer)) != 0)
            {
                break;
            }

            while(curChar != EndChar && (isspace(curChar) || curChar == 0))
            {
                curChar = ReadChar(configFile);
            }

            if (curChar == EndChar)
            {
                break;
            }
            else
            {
                UnreadChar(curChar, configFile);
            }

            index = 0;
        }
        else
        {
            // The expectation is that non-ANSI characters
            // are not used in the config- otherwise it will
            // be interpreted incorrectly here
            configBuffer[index++] = (char16) curChar;
        }
    }

#undef ReadChar
#undef UnreadChar
#undef CharType
#undef EndChar

    fclose(configFile);

    if (err !=0)
    {
        return;
    }
#endif
}